

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool rw::readChunkHeaderInfo(Stream *s,ChunkHeaderInfo *header)

{
  int iVar1;
  uint32 uVar2;
  uint uVar3;
  anon_struct_12_3_2a00130e buf;
  
  (*s->_vptr_Stream[4])(s,&buf,0xc);
  iVar1 = (*s->_vptr_Stream[7])(s);
  if ((byte)iVar1 == 0) {
    header->type = buf.type;
    header->length = buf.size;
    uVar2 = libraryIDUnpackVersion(buf.id);
    header->version = uVar2;
    uVar3 = buf.id & 0xffff;
    if (buf.id < 0x10000) {
      uVar3 = 0;
    }
    header->build = uVar3;
  }
  return (bool)((byte)iVar1 ^ 1);
}

Assistant:

bool
readChunkHeaderInfo(Stream *s, ChunkHeaderInfo *header)
{
	struct {
		int32 type, size;
		uint32 id;
	} buf;
	s->read32(&buf, 12);
	if(s->eof())
		return false;
	assert(header != nil);
	header->type = buf.type;
	header->length = buf.size;
	header->version = libraryIDUnpackVersion(buf.id);
	header->build = libraryIDUnpackBuild(buf.id);
	return true;
}